

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O0

void frame_received(void *context,uchar *type_specific,uint32_t type_specific_size,uchar *frame_body
                   ,uint32_t frame_body_size)

{
  short sVar1;
  int iVar2;
  bool bVar3;
  uint16_t channel;
  AMQP_FRAME_CODEC_HANDLE amqp_frame_codec;
  uchar *puStack_28;
  uint32_t frame_body_size_local;
  uchar *frame_body_local;
  uint32_t type_specific_size_local;
  uchar *type_specific_local;
  void *context_local;
  
  if (*(int *)((long)context + 0x30) == 0) {
    if (type_specific_size < 2) {
      *(undefined4 *)((long)context + 0x30) = 1;
      (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x20));
    }
    else {
      sVar1 = (ushort)*type_specific * 0x100 + (ushort)type_specific[1];
      if (frame_body_size == 0) {
        (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),sVar1);
      }
      else {
        *(undefined8 *)((long)context + 0x38) = 0;
        amqp_frame_codec._4_4_ = frame_body_size;
        puStack_28 = frame_body;
        while( true ) {
          bVar3 = false;
          if ((amqp_frame_codec._4_4_ != 0) && (bVar3 = false, *(long *)((long)context + 0x38) == 0)
             ) {
            bVar3 = *(int *)((long)context + 0x30) != 1;
          }
          if (!bVar3) break;
          iVar2 = amqpvalue_decode_bytes
                            (*(AMQPVALUE_DECODER_HANDLE *)((long)context + 0x28),puStack_28,1);
          if (iVar2 == 0) {
            amqp_frame_codec._4_4_ = amqp_frame_codec._4_4_ - 1;
            puStack_28 = puStack_28 + 1;
          }
          else {
            *(undefined4 *)((long)context + 0x30) = 1;
          }
        }
        if (*(int *)((long)context + 0x30) == 1) {
          (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x20));
        }
        else {
          (**(code **)((long)context + 8))
                    (*(undefined8 *)((long)context + 0x20),sVar1,
                     *(undefined8 *)((long)context + 0x38),puStack_28,amqp_frame_codec._4_4_);
        }
      }
    }
  }
  return;
}

Assistant:

static void frame_received(void* context, const unsigned char* type_specific, uint32_t type_specific_size, const unsigned char* frame_body, uint32_t frame_body_size)
{
    AMQP_FRAME_CODEC_HANDLE amqp_frame_codec = (AMQP_FRAME_CODEC_HANDLE)context;
    uint16_t channel;

    switch (amqp_frame_codec->decode_state)
    {
    default:
    /* Codes_SRS_AMQP_FRAME_CODEC_01_050: [All subsequent decoding shall fail and no AMQP frames shall be indicated from that point on to the consumers of amqp_frame_codec.] */
    case AMQP_FRAME_DECODE_ERROR:
        break;

    case AMQP_FRAME_DECODE_FRAME:
        /* Codes_SRS_AMQP_FRAME_CODEC_01_049: [If not enough type specific bytes are received to decode the channel number, the decoding shall stop with an error.] */
        if (type_specific_size < 2)
        {
            amqp_frame_codec->decode_state = AMQP_FRAME_DECODE_ERROR;

            /* Codes_SRS_AMQP_FRAME_CODEC_01_069: [If any error occurs while decoding a frame, the decoder shall indicate the error by calling the amqp_frame_codec_error_callback  and passing to it the callback context argument that was given in amqp_frame_codec_create.] */
            amqp_frame_codec->error_callback(amqp_frame_codec->callback_context);
        }
        else
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_001: [Bytes 6 and 7 of an AMQP frame contain the channel number ] */
            channel = ((uint16_t)type_specific[0]) << 8;
            channel += type_specific[1];

            if (frame_body_size == 0)
            {
                /* Codes_SRS_AMQP_FRAME_CODEC_01_048: [When a frame header is received from frame_codec and the frame payload size is 0, empty_frame_received_callback shall be invoked, while passing the channel number as argument.] */
                /* Codes_SRS_AMQP_FRAME_CODEC_01_007: [An AMQP frame with no body MAY be used to generate artificial traffic as needed to satisfy any negotiated idle timeout interval ] */
                amqp_frame_codec->empty_frame_received_callback(amqp_frame_codec->callback_context, channel);
            }
            else
            {
                /* Codes_SRS_AMQP_FRAME_CODEC_01_051: [If the frame payload is greater than 0, amqp_frame_codec shall decode the performative as a described AMQP type.] */
                /* Codes_SRS_AMQP_FRAME_CODEC_01_002: [The frame body is defined as a performative followed by an opaque payload.] */
                amqp_frame_codec->decoded_performative = NULL;

                while ((frame_body_size > 0) &&
                       (amqp_frame_codec->decoded_performative == NULL) &&
                       (amqp_frame_codec->decode_state != AMQP_FRAME_DECODE_ERROR))
                {
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_052: [Decoding the performative shall be done by feeding the bytes to the decoder create in amqp_frame_codec_create.] */
                    if (amqpvalue_decode_bytes(amqp_frame_codec->decoder, frame_body, 1) != 0)
                    {
                        /* Codes_SRS_AMQP_FRAME_CODEC_01_060: [If any error occurs while decoding a frame, the decoder shall switch to an error state where decoding shall not be possible anymore.] */
                        amqp_frame_codec->decode_state = AMQP_FRAME_DECODE_ERROR;
                    }
                    else
                    {
                        frame_body_size--;
                        frame_body++;
                    }
                }

                if (amqp_frame_codec->decode_state == AMQP_FRAME_DECODE_ERROR)
                {
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_069: [If any error occurs while decoding a frame, the decoder shall indicate the error by calling the amqp_frame_codec_error_callback  and passing to it the callback context argument that was given in amqp_frame_codec_create.] */
                    amqp_frame_codec->error_callback(amqp_frame_codec->callback_context);
                }
                else
                {
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_004: [The remaining bytes in the frame body form the payload for that frame.] */
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_067: [When the performative is decoded, the rest of the frame_bytes shall not be given to the AMQP decoder, but they shall be buffered so that later they are given to the frame_received callback.] */
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_054: [Once the performative is decoded and all frame payload bytes are received, the callback frame_received_callback shall be called.] */
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_068: [A pointer to all the payload bytes shall also be passed to frame_received_callback.] */
                    amqp_frame_codec->frame_received_callback(amqp_frame_codec->callback_context, channel, amqp_frame_codec->decoded_performative, frame_body, frame_body_size);
                }
            }
        }
        break;
    }
}